

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestLaunch.cxx
# Opt level: O1

bool __thiscall cmCTestLaunch::ScrapeLog(cmCTestLaunch *this,string *fname)

{
  cmCTestLaunchReporter *this_00;
  bool bVar1;
  bool bVar2;
  string line;
  ifstream fin;
  string local_258;
  istream local_238;
  
  LoadScrapeRules(this);
  std::ifstream::ifstream(&local_238,(fname->_M_dataplus)._M_p,_S_in|_S_bin);
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = '\0';
  this_00 = &this->Reporter;
  do {
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          (&local_238,&local_258,(bool *)0x0,0xffffffffffffffff);
        if (!bVar1) goto LAB_001e6b3b;
        bVar2 = cmCTestLaunchReporter::MatchesFilterPrefix(this_00,&local_258);
      } while (bVar2);
      bVar2 = cmCTestLaunchReporter::Match(this_00,&local_258,&(this->Reporter).RegexWarning);
    } while (!bVar2);
    bVar2 = cmCTestLaunchReporter::Match(this_00,&local_258,&(this->Reporter).RegexWarningSuppress);
  } while (bVar2);
LAB_001e6b3b:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,
                    CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                             local_258.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(&local_238);
  return bVar1;
}

Assistant:

bool cmCTestLaunch::ScrapeLog(std::string const& fname)
{
  this->LoadScrapeRules();

  // Look for log file lines matching warning expressions but not
  // suppression expressions.
  cmsys::ifstream fin(fname.c_str(), std::ios::in | std::ios::binary);
  std::string line;
  while (cmSystemTools::GetLineFromStream(fin, line)) {
    if (this->Reporter.MatchesFilterPrefix(line)) {
      continue;
    }

    if (this->Reporter.Match(line, this->Reporter.RegexWarning) &&
        !this->Reporter.Match(line, this->Reporter.RegexWarningSuppress)) {
      return true;
    }
  }
  return false;
}